

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

bool wasm::DataFlow::allInputsConstant(Node *node)

{
  Id IVar1;
  bool bVar2;
  Index i_00;
  Node *pNVar3;
  ulong uVar4;
  Index i;
  ulong uVar5;
  
  if (node->type == Expr) {
    IVar1 = ((node->field_1).expr)->_id;
    if (IVar1 == SelectId) {
      pNVar3 = Node::getValue(node,0);
      if (pNVar3->type != Expr) {
        return false;
      }
      if (((pNVar3->field_1).expr)->_id != ConstId) {
        return false;
      }
      pNVar3 = Node::getValue(node,1);
      if (pNVar3->type != Expr) {
        return false;
      }
      if (((pNVar3->field_1).expr)->_id != ConstId) {
        return false;
      }
      i_00 = 2;
    }
    else {
      if (IVar1 != BinaryId) {
        if (IVar1 != UnaryId) {
          return false;
        }
        pNVar3 = Node::getValue(node,0);
        if (pNVar3->type != Expr) {
          return false;
        }
        goto LAB_0081ade4;
      }
      pNVar3 = Node::getValue(node,0);
      if (pNVar3->type != Expr) {
        return false;
      }
      if (((pNVar3->field_1).expr)->_id != ConstId) {
        return false;
      }
      i_00 = 1;
    }
    pNVar3 = Node::getValue(node,i_00);
    if (pNVar3->type == Expr) {
LAB_0081ade4:
      return ((pNVar3->field_1).expr)->_id == ConstId;
    }
  }
  else if (node->type == Phi) {
    uVar5 = 1;
    while( true ) {
      uVar4 = (long)(node->values).
                    super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(node->values).
                    super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3;
      bVar2 = uVar4 <= uVar5;
      if (uVar4 <= uVar5) {
        return bVar2;
      }
      pNVar3 = Node::getValue(node,(Index)uVar5);
      if (pNVar3->type != Expr) break;
      uVar5 = (ulong)((Index)uVar5 + 1);
      if (((pNVar3->field_1).expr)->_id != ConstId) {
        return bVar2;
      }
    }
    return bVar2;
  }
  return false;
}

Assistant:

inline bool allInputsConstant(Node* node) {
  switch (node->type) {
    case Node::Type::Expr: {
      if (node->expr->is<Unary>()) {
        return node->getValue(0)->isConst();
      } else if (node->expr->is<Binary>()) {
        return node->getValue(0)->isConst() && node->getValue(1)->isConst();
      } else if (node->expr->is<Select>()) {
        return node->getValue(0)->isConst() && node->getValue(1)->isConst() &&
               node->getValue(2)->isConst();
      }
      break;
    }
    case Node::Type::Phi: {
      // Check if any of the others are not equal
      for (Index i = 1; i < node->values.size(); i++) {
        if (!node->getValue(i)->isConst()) {
          return false;
        }
      }
      return true;
    }
    default: {}
  }
  return false;
}